

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O3

value * mjs::string_search(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                          string *str,value *regexp)

{
  regexp_object *this;
  double dVar1;
  gc_heap_ptr_untyped gStack_28;
  
  anon_unknown_35::to_regexp_object((anon_unknown_35 *)&gStack_28,global,regexp);
  this = (regexp_object *)gc_heap_ptr_untyped::get(&gStack_28);
  dVar1 = regexp_object::search(this,str);
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = dVar1;
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_28);
  return __return_storage_ptr__;
}

Assistant:

value string_search(const gc_heap_ptr<global_object>& global, const string& str, const value& regexp) {
    return value{to_regexp_object(global, regexp)->search(str)};
}